

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int base64_decode(char *in_base64,int in_len,char *out_bin,int out_len)

{
  int iVar1;
  base64_decodestate local_2c;
  base64_decodestate state;
  int out_len_local;
  char *out_bin_local;
  int in_len_local;
  char *in_base64_local;
  
  state.step = out_len;
  unique0x10000046 = out_bin;
  base64_decodestate_init(&local_2c);
  iVar1 = base64_decode_block(in_base64,in_len,stack0xffffffffffffffe0,state.step,&local_2c);
  return iVar1;
}

Assistant:

int
base64_decode(const char *in_base64, int in_len,
	      char *out_bin, int out_len)
{
	struct base64_decodestate state;
	base64_decodestate_init(&state);
	return base64_decode_block(in_base64, in_len,
				   out_bin, out_len, &state);
}